

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

bool __thiscall asmjit::v1_14::String::equals(String *this,char *other,size_t size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  String *__s1;
  bool bVar4;
  
  uVar2 = (ulong)(byte)*this;
  if (uVar2 < 0x1f) {
    __s1 = this + 1;
  }
  else {
    uVar2 = *(ulong *)(this + 8);
    __s1 = *(String **)(this + 0x18);
  }
  if (size == 0xffffffffffffffff) {
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        if (__s1[uVar3] != *(String *)(other + uVar3)) {
          return false;
        }
        if (*(String *)(other + uVar3) == (String)0x0) {
          return false;
        }
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    bVar4 = other[uVar2] == '\0';
  }
  else if (uVar2 == size) {
    iVar1 = bcmp(__s1,other,size);
    bVar4 = iVar1 == 0;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool String::equals(const char* other, size_t size) const noexcept {
  const char* aData = data();
  const char* bData = other;

  size_t aSize = this->size();
  size_t bSize = size;

  if (bSize == SIZE_MAX) {
    size_t i;
    for (i = 0; i < aSize; i++)
      if (aData[i] != bData[i] || bData[i] == 0)
        return false;
    return bData[i] == 0;
  }
  else {
    if (aSize != bSize)
      return false;
    return ::memcmp(aData, bData, aSize) == 0;
  }
}